

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O3

SSVectorBase<double> * __thiscall
soplex::SSVectorBase<double>::assign2product4setup<double,double>
          (SSVectorBase<double> *this,SVSetBase<double> *A,SSVectorBase<double> *x,Timer *timeSparse
          ,Timer *timeFull,int *nCallsSparse,int *nCallsFull)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  pointer pdVar6;
  DataKey *pDVar7;
  pointer pdVar8;
  Nonzero<double> *pNVar9;
  bool bVar10;
  bool bVar11;
  long lVar12;
  _func_int **pp_Var13;
  ulong uVar14;
  long lVar15;
  int *piVar16;
  int i;
  long lVar17;
  ulong uVar18;
  Item *pIVar19;
  long lVar20;
  Real RVar21;
  
  clear(this);
  uVar2 = (x->super_IdxSet).num;
  if ((ulong)uVar2 == 1) {
    if (timeSparse == (Timer *)0x0) {
      iVar3 = *(x->super_IdxSet).idx;
      dVar1 = (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[iVar3];
      pIVar19 = (A->set).theitem + (A->set).thekey[iVar3].idx;
      RVar21 = Tolerances::epsilon((this->_tolerances).
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      if (RVar21 < ABS(dVar1)) {
        uVar2 = (pIVar19->data).super_SVectorBase<double>.memused;
        uVar18 = (ulong)uVar2;
        if (uVar18 != 0) {
          (this->super_IdxSet).num = uVar2;
          if (0 < (int)uVar2) {
            piVar5 = (this->super_IdxSet).idx;
            pdVar6 = (this->super_VectorBase<double>).val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar14 = uVar18 + 1;
            piVar16 = &(pIVar19->data).super_SVectorBase<double>.m_elem[uVar18 - 1].idx;
            do {
              iVar3 = *piVar16;
              piVar5[uVar14 - 2] = iVar3;
              pdVar6[iVar3] = ((Nonzero<double> *)(piVar16 + -2))->val * dVar1;
              uVar14 = uVar14 - 1;
              piVar16 = piVar16 + -4;
            } while (1 < uVar14);
          }
          goto LAB_001f9f32;
        }
      }
      clear(this);
LAB_001f9f32:
      this->setupStatus = true;
      goto LAB_001f9f37;
    }
    (*timeSparse->_vptr_Timer[3])(timeSparse);
    iVar3 = *(x->super_IdxSet).idx;
    dVar1 = (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar3];
    pIVar19 = (A->set).theitem + (A->set).thekey[iVar3].idx;
    RVar21 = Tolerances::epsilon((this->_tolerances).
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    if (RVar21 < ABS(dVar1)) {
      uVar2 = (pIVar19->data).super_SVectorBase<double>.memused;
      uVar18 = (ulong)uVar2;
      if (uVar18 != 0) {
        (this->super_IdxSet).num = uVar2;
        if (0 < (int)uVar2) {
          piVar5 = (this->super_IdxSet).idx;
          pdVar6 = (this->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar14 = uVar18 + 1;
          piVar16 = &(pIVar19->data).super_SVectorBase<double>.m_elem[uVar18 - 1].idx;
          do {
            iVar3 = *piVar16;
            piVar5[uVar14 - 2] = iVar3;
            pdVar6[iVar3] = ((Nonzero<double> *)(piVar16 + -2))->val * dVar1;
            uVar14 = uVar14 - 1;
            piVar16 = piVar16 + -4;
          } while (1 < uVar14);
        }
        goto LAB_001f9f14;
      }
    }
    clear(this);
LAB_001f9f14:
    this->setupStatus = true;
    pp_Var13 = timeSparse->_vptr_Timer;
  }
  else {
    if ((this->setupStatus == true) &&
       ((double)(A->super_ClassArray<soplex::Nonzero<double>_>).thesize * (double)(int)uVar2 <=
        (double)(A->set).thenum *
        (double)(int)((ulong)((long)(this->super_VectorBase<double>).val.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)(this->super_VectorBase<double>).val.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 3) * 0.5)) {
      if (timeSparse == (Timer *)0x0) {
        assign2productShort<double,double>(this,A,x);
        goto LAB_001f9f32;
      }
      (*timeSparse->_vptr_Timer[3])(timeSparse);
      assign2productShort<double,double>(this,A,x);
      goto LAB_001f9f14;
    }
    nCallsSparse = nCallsFull;
    if (timeFull == (Timer *)0x0) {
      if ((int)uVar2 < 1) {
LAB_001f9edf:
        clear(this);
      }
      else {
        piVar5 = (x->super_IdxSet).idx;
        pdVar6 = (x->super_VectorBase<double>).val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pIVar19 = (A->set).theitem;
        pDVar7 = (A->set).thekey;
        pdVar8 = (this->super_VectorBase<double>).val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        bVar10 = true;
        uVar18 = 0;
        do {
          iVar3 = piVar5[uVar18];
          iVar4 = pDVar7[iVar3].idx;
          bVar11 = bVar10;
          if (bVar10) {
            bVar11 = false;
          }
          lVar12 = (long)pIVar19[iVar4].data.super_SVectorBase<double>.memused;
          if (0 < lVar12) {
            dVar1 = pdVar6[iVar3];
            pNVar9 = pIVar19[iVar4].data.super_SVectorBase<double>.m_elem;
            lVar17 = 0;
            do {
              iVar3 = *(int *)((long)&pNVar9->idx + lVar17);
              pdVar8[iVar3] = *(double *)((long)&pNVar9->val + lVar17) * dVar1 + pdVar8[iVar3];
              lVar17 = lVar17 + 0x10;
              bVar10 = bVar11;
            } while (lVar12 * 0x10 != lVar17);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != uVar2);
        if (bVar10) goto LAB_001f9edf;
      }
      this->setupStatus = false;
      goto LAB_001f9f37;
    }
    (*timeFull->_vptr_Timer[3])(timeFull);
    lVar12 = (long)(x->super_IdxSet).num;
    if (lVar12 < 1) {
LAB_001f9d78:
      clear(this);
    }
    else {
      piVar5 = (x->super_IdxSet).idx;
      pdVar6 = (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pIVar19 = (A->set).theitem;
      pDVar7 = (A->set).thekey;
      pdVar8 = (this->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      bVar10 = true;
      lVar17 = 0;
      do {
        iVar3 = piVar5[lVar17];
        iVar4 = pDVar7[iVar3].idx;
        bVar11 = bVar10;
        if (bVar10) {
          bVar11 = false;
        }
        lVar20 = (long)pIVar19[iVar4].data.super_SVectorBase<double>.memused;
        if (0 < lVar20) {
          dVar1 = pdVar6[iVar3];
          pNVar9 = pIVar19[iVar4].data.super_SVectorBase<double>.m_elem;
          lVar15 = 0;
          do {
            iVar3 = *(int *)((long)&pNVar9->idx + lVar15);
            pdVar8[iVar3] = *(double *)((long)&pNVar9->val + lVar15) * dVar1 + pdVar8[iVar3];
            lVar15 = lVar15 + 0x10;
            bVar10 = bVar11;
          } while (lVar20 * 0x10 != lVar15);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != lVar12);
      if (bVar10) goto LAB_001f9d78;
    }
    this->setupStatus = false;
    pp_Var13 = timeFull->_vptr_Timer;
    timeSparse = timeFull;
  }
  (*pp_Var13[4])(timeSparse);
LAB_001f9f37:
  *nCallsSparse = *nCallsSparse + 1;
  return this;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assign2product4setup(const SVSetBase<S>& A,
      const SSVectorBase<T>& x,
      Timer* timeSparse, Timer* timeFull,
      int& nCallsSparse, int& nCallsFull
                                                      )
{
   assert(A.num() == x.dim());
   assert(x.isSetup());
   clear();

   if(x.size() == 1)
   {
      if(timeSparse != nullptr)
         timeSparse->start();

      assign2product1(A, x);
      setupStatus = true;

      if(timeSparse != nullptr)
         timeSparse->stop();

      ++nCallsSparse;
   }
   else if(isSetup()
           && (double(x.size()) * A.memSize() <= SOPLEX_SHORTPRODUCT_FACTOR * dim() * A.num()))
   {
      if(timeSparse != nullptr)
         timeSparse->start();

      assign2productShort(A, x);
      setupStatus = true;

      if(timeSparse != nullptr)
         timeSparse->stop();

      ++nCallsSparse;
   }
   else
   {
      if(timeFull != nullptr)
         timeFull->start();

      assign2productFull(A, x);
      setupStatus = false;

      if(timeFull != nullptr)
         timeFull->stop();

      ++nCallsFull;
   }

   assert(isConsistent());

   return *this;
}